

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

void __thiscall spv::Builder::If::If(If *this,Id cond,uint ctrl,Builder *gb)

{
  Id IVar1;
  Block *pBVar2;
  Function *pFVar3;
  Builder *gb_local;
  uint ctrl_local;
  Id cond_local;
  If *this_local;
  
  this->builder = gb;
  this->condition = cond;
  this->control = ctrl;
  this->elseBlock = (Block *)0x0;
  pBVar2 = getBuildPoint(this->builder);
  pFVar3 = Block::getParent(pBVar2);
  this->function = pFVar3;
  pBVar2 = (Block *)::operator_new(0x90);
  IVar1 = getUniqueId(this->builder);
  Block::Block(pBVar2,IVar1,this->function);
  this->thenBlock = pBVar2;
  pBVar2 = (Block *)::operator_new(0x90);
  IVar1 = getUniqueId(this->builder);
  Block::Block(pBVar2,IVar1,this->function);
  this->mergeBlock = pBVar2;
  pBVar2 = getBuildPoint(this->builder);
  this->headerBlock = pBVar2;
  createSelectionMerge(this->builder,this->mergeBlock,this->control);
  spv::Function::addBlock(this->function,this->thenBlock);
  setBuildPoint(this->builder,this->thenBlock);
  return;
}

Assistant:

Builder::If::If(Id cond, unsigned int ctrl, Builder& gb) :
    builder(gb),
    condition(cond),
    control(ctrl),
    elseBlock(nullptr)
{
    function = &builder.getBuildPoint()->getParent();

    // make the blocks, but only put the then-block into the function,
    // the else-block and merge-block will be added later, in order, after
    // earlier code is emitted
    thenBlock = new Block(builder.getUniqueId(), *function);
    mergeBlock = new Block(builder.getUniqueId(), *function);

    // Save the current block, so that we can add in the flow control split when
    // makeEndIf is called.
    headerBlock = builder.getBuildPoint();
    builder.createSelectionMerge(mergeBlock, control);

    function->addBlock(thenBlock);
    builder.setBuildPoint(thenBlock);
}